

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

void __thiscall
Js::SourceTextModuleRecord::ReleaseParserResourcesForHierarchy(SourceTextModuleRecord *this)

{
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  Parser *this_00;
  uint uVar2;
  Type pSVar3;
  int iVar4;
  ulong uVar5;
  
  if (this->parser != (Parser *)0x0) {
    Parser::ReleaseTemporaryGuestArena(this->parser);
  }
  pBVar1 = (this->childrenModuleSet).ptr;
  if (pBVar1 != (BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) {
    uVar2 = pBVar1->bucketCount;
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        iVar4 = pBVar1->buckets[uVar5];
        if (iVar4 != -1) {
          pSVar3 = pBVar1->entries;
          do {
            this_00 = (pSVar3[iVar4].
                       super_DefaultHashedEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                       super_ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                       .
                       super_KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>
                      .value)->parser;
            if (this_00 != (Parser *)0x0) {
              Parser::ReleaseTemporaryGuestArena(this_00);
              pSVar3 = pBVar1->entries;
            }
            iVar4 = pSVar3[iVar4].
                    super_DefaultHashedEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                    super_ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                    .super_KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                    next;
          } while (iVar4 != -1);
          uVar2 = pBVar1->bucketCount;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar2);
    }
  }
  return;
}

Assistant:

void SourceTextModuleRecord::ReleaseParserResourcesForHierarchy()
    {
        this->ReleaseParserResources();

        if (this->childrenModuleSet != nullptr)
        {
            this->childrenModuleSet->EachValue([=](SourceTextModuleRecord* childModuleRecord)
            {
                childModuleRecord->ReleaseParserResources();
            });
        }
    }